

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Cluster::GetLast(Cluster *this,BlockEntry **pLast)

{
  BlockEntry *pBVar1;
  long lVar2;
  char cVar3;
  long unaff_R15;
  long len;
  longlong pos;
  long lStack_38;
  longlong local_30;
  
  do {
    lVar2 = Parse(this,&local_30,&lStack_38);
    if (lVar2 < 0) {
      *pLast = (BlockEntry *)0x0;
      cVar3 = '\x01';
    }
    else {
      cVar3 = (lVar2 != 0) * '\x02';
      lVar2 = unaff_R15;
    }
    unaff_R15 = lVar2;
  } while (cVar3 == '\0');
  if (cVar3 != '\x01') {
    if (this->m_entries_count < 1) {
      *pLast = (BlockEntry *)0x0;
    }
    else {
      if (this->m_entries == (BlockEntry **)0x0) {
        __assert_fail("m_entries",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1cde,"long mkvparser::Cluster::GetLast(const BlockEntry *&) const");
      }
      pBVar1 = this->m_entries[this->m_entries_count + -1];
      *pLast = pBVar1;
      if (pBVar1 == (BlockEntry *)0x0) {
        __assert_fail("pLast",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1ce3,"long mkvparser::Cluster::GetLast(const BlockEntry *&) const");
      }
    }
    lVar2 = 0;
  }
  return lVar2;
}

Assistant:

long Cluster::GetLast(const BlockEntry*& pLast) const {
  for (;;) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pLast = NULL;
      return status;
    }

    if (status > 0)  // no new block
      break;
  }

  if (m_entries_count <= 0) {
    pLast = NULL;
    return 0;
  }

  assert(m_entries);

  const long idx = m_entries_count - 1;

  pLast = m_entries[idx];
  assert(pLast);

  return 0;
}